

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall
QMimeBinaryProvider::addFileNameMatches
          (QMimeBinaryProvider *this,QString *fileName,QMimeGlobMatchResult *result)

{
  CacheFile *pCVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size != 0) {
    pCVar1 = (this->m_cacheFile)._M_t.
             super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl;
    uVar6 = *(uint *)(pCVar1->data + 0xc);
    iVar4 = matchGlobList(this,result,pCVar1,
                          uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                          uVar6 << 0x18,fileName);
    if (iVar4 == 0) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::toLower_helper((QString *)&local_58,fileName);
      pCVar1 = (this->m_cacheFile)._M_t.
               super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
               .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl;
      puVar2 = pCVar1->data;
      uVar6 = *(uint *)(puVar2 + 0x10);
      lVar5 = (long)(int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                         uVar6 << 0x18);
      uVar6 = *(uint *)(puVar2 + lVar5);
      uVar7 = *(uint *)(puVar2 + lVar5 + 4);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      bVar3 = matchSuffixTree(this,result,pCVar1,uVar6,uVar7,(QString *)&local_58,
                              (qsizetype)(local_58.size + -1),false);
      if (bVar3) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      else {
        bVar3 = matchSuffixTree(this,result,
                                (this->m_cacheFile)._M_t.
                                super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                                .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>.
                                _M_head_impl,uVar6,uVar7,fileName,(fileName->d).size + -1,true);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (!bVar3) {
          pCVar1 = (this->m_cacheFile)._M_t.
                   super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                   .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl;
          uVar6 = *(uint *)(pCVar1->data + 0x14);
          matchGlobList(this,result,pCVar1,
                        uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                        uVar6 << 0x18,fileName);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeBinaryProvider::addFileNameMatches(const QString &fileName, QMimeGlobMatchResult &result)
{
    if (fileName.isEmpty())
        return;
    Q_ASSERT(m_cacheFile);
    int numMatches = 0;
    // Check literals (e.g. "Makefile")
    numMatches = matchGlobList(result, m_cacheFile.get(),
                               m_cacheFile->getUint32(PosLiteralListOffset), fileName);
    // Check the very common *.txt cases with the suffix tree
    if (numMatches == 0) {
        const QString lowerFileName = fileName.toLower();
        const int reverseSuffixTreeOffset = m_cacheFile->getUint32(PosReverseSuffixTreeOffset);
        const int numRoots = m_cacheFile->getUint32(reverseSuffixTreeOffset);
        const int firstRootOffset = m_cacheFile->getUint32(reverseSuffixTreeOffset + 4);
        if (matchSuffixTree(result, m_cacheFile.get(), numRoots, firstRootOffset, lowerFileName,
                            lowerFileName.size() - 1, false)) {
            ++numMatches;
        } else if (matchSuffixTree(result, m_cacheFile.get(), numRoots, firstRootOffset, fileName,
                                   fileName.size() - 1, true)) {
            ++numMatches;
        }
    }
    // Check complex globs (e.g. "callgrind.out[0-9]*" or "README*")
    if (numMatches == 0)
        matchGlobList(result, m_cacheFile.get(), m_cacheFile->getUint32(PosGlobListOffset),
                      fileName);
}